

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

bool duckdb::IsScalarFunction(CatalogType type)

{
  return (bool)((byte)(0x4c000000 >> (type & TABLE_MACRO_ENTRY)) & type < TABLE_MACRO_ENTRY);
}

Assistant:

bool IsScalarFunction(CatalogType type) {
	switch (type) {
	case CatalogType::SCALAR_FUNCTION_ENTRY:
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
	case CatalogType::MACRO_ENTRY:
		return true;
	default:
		return false;
	}
}